

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Dot_Access_AST_Node::eval_internal(Dot_Access_AST_Node *this,Dispatch_State *t_ss)

{
  __pthread_internal_list *p_Var1;
  __pthread_internal_list *p_Var2;
  undefined8 *puVar3;
  Dispatch_Engine *t_name;
  undefined8 this_00;
  element_type *peVar4;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  Boxed_Value BVar8;
  initializer_list<chaiscript::Boxed_Value> __l;
  initializer_list<chaiscript::Boxed_Value> __l_00;
  allocator local_ea;
  allocator_type local_e9;
  Dispatch_State *local_e8;
  undefined1 local_e0 [40];
  Function_Push_Pop fpp;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_b0 [2];
  element_type *local_90;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_70;
  undefined1 local_50 [32];
  
  detail::Function_Push_Pop::Function_Push_Pop(&fpp,in_RDX);
  local_e8 = in_RDX;
  AST_Node::eval(&this->super_AST_Node,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  local_e0._32_8_ = this;
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_e0,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this);
  __l._M_len = 1;
  __l._M_array = (iterator)local_e0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&params,__l,(allocator_type *)local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  p_Var1 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.
           __list.__next;
  p_Var2 = p_Var1[6].__prev;
  uVar5 = (long)p_Var1[6].__next - (long)p_Var2;
  local_90 = (element_type *)t_ss;
  if (0x10 < uVar5) {
    lVar6 = (long)p_Var2[1].__prev;
    puVar3 = *(undefined8 **)(lVar6 + 0x68);
    for (puVar7 = *(undefined8 **)(lVar6 + 0x60); puVar7 != puVar3; puVar7 = puVar7 + 2) {
      AST_Node::eval((AST_Node *)local_e0,(Dispatch_State *)*puVar7);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
      emplace_back<chaiscript::Boxed_Value>(&params,(Boxed_Value *)local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
    }
  }
  detail::Function_Push_Pop::save_params(&fpp,&params);
  peVar4 = local_90;
  this_00 = local_e0._32_8_;
  chaiscript::detail::Dispatch_Engine::call_member
            ((Dispatch_Engine *)local_e0,(string *)(local_e8->m_engine)._M_data,
             (atomic_uint_fast32_t *)((long)&local_90[4].field_2 + 8),
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             &local_90[4]._M_string_length,SUB81(&params,0),
             (Type_Conversions_State *)(ulong)(0x10 < uVar5));
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  if (*(int *)&(((reference_wrapper<chaiscript::detail::Dispatch_Engine> *)&peVar4[3]._M_dataplus)->
                _M_data->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next[1].
               __next == 0x12) {
    t_name = (local_e8->m_engine)._M_data;
    std::__cxx11::string::string((string *)local_e0,"[]",&local_ea);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_b0,(__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                        this_00);
    AST_Node::eval((AST_Node *)(local_b0 + 1),
                   (Dispatch_State *)
                   (((reference_wrapper<chaiscript::detail::Dispatch_Engine> *)
                    &peVar4[3]._M_dataplus)->_M_data->m_mutex).super_mutex.super___mutex_base.
                   _M_mutex.__data.__list.__next[6].__prev[1].__prev);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_b0;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_70,__l_00,&local_e9);
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)local_50,(string *)t_name,(atomic_uint_fast32_t *)local_e0,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               &peVar4[4].field_2,(Type_Conversions_State *)&local_70);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_70);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_b0[0]._M_ptr + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::__cxx11::string::~string((string *)local_e0);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&params);
  detail::Function_Push_Pop::~Function_Push_Pop(&fpp);
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this_00;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);


          Boxed_Value retval = children[0]->eval(t_ss);
          std::vector<Boxed_Value> params{retval};

          bool has_function_params = false;
          if (children[2]->children.size() > 1) {
            has_function_params = true;
            for (const auto &child : children[2]->children[1]->children) {
              params.push_back(child->eval(t_ss));
            }
          }

          fpp.save_params(params);

          try {
            retval = t_ss->call_member(m_fun_name, m_loc, std::move(params), has_function_params, t_ss.conversions());
          }
          catch(const exception::dispatch_error &e){
            if (e.functions.empty())
            {
              throw exception::eval_error("'" + m_fun_name + "' is not a function.");
            } else {
              throw exception::eval_error(std::string(e.what()) + " for function '" + m_fun_name + "'", e.parameters, e.functions, true, *t_ss);
            }
          }
          catch(detail::Return_Value &rv) {
            retval = std::move(rv.retval);
          }

          if (this->children[2]->identifier == AST_Node_Type::Array_Call) {
            try {
              retval = t_ss->call_function("[]", m_array_loc, {retval, this->children[2]->children[1]->eval(t_ss)}, t_ss.conversions());
            }
            catch(const exception::dispatch_error &e){
              throw exception::eval_error("Can not find appropriate array lookup operator '[]'.", e.parameters, e.functions, true, *t_ss);
            }
          }

          return retval;
        }